

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_initCStream_advanced
                 (ZSTD_CStream *zcs,void *dict,size_t dictSize,ZSTD_parameters params,
                 unsigned_long_long pledgedSrcSize)

{
  ZSTD_CCtx_params params_00;
  ZSTD_compressionParameters cParams;
  undefined1 auVar1 [20];
  ZSTD_CCtx_params cctxParams;
  ZSTD_parameters params_01;
  undefined1 auVar2 [28];
  uint uVar3;
  void *__dest;
  undefined4 in_stack_fffffffffffffe84;
  ZSTD_strategy in_stack_fffffffffffffe88;
  undefined8 in_stack_ffffffffffffff10;
  undefined1 local_b8 [128];
  ZSTD_CStream *local_38;
  size_t errcod;
  unsigned_long_long pledgedSrcSize_local;
  size_t dictSize_local;
  void *dict_local;
  ZSTD_CStream *zcs_local;
  
  auVar1 = params.cParams._8_20_;
  cParams.targetLength = in_stack_fffffffffffffe84;
  cParams.windowLog = auVar1._0_4_;
  cParams.chainLog = auVar1._4_4_;
  cParams.hashLog = auVar1._8_4_;
  cParams.searchLog = auVar1._12_4_;
  cParams.minMatch = auVar1._16_4_;
  cParams.strategy = in_stack_fffffffffffffe88;
  errcod = pledgedSrcSize;
  pledgedSrcSize_local = dictSize;
  dictSize_local = (size_t)dict;
  dict_local = zcs;
  local_38 = (ZSTD_CStream *)ZSTD_checkCParams(cParams);
  uVar3 = ERR_isError((size_t)local_38);
  if (uVar3 == 0) {
    if ((errcod == 0) && (params.fParams == (ZSTD_frameParameters)0x0)) {
      errcod = 0xffffffffffffffff;
    }
    __dest = (void *)((long)dict_local + 0x10);
    cctxParams.cParams.minMatch = (int)((ulong)*(undefined8 *)((long)dict_local + 0x28) >> 0x20);
    cctxParams._0_20_ = *(undefined1 (*) [20])((long)dict_local + 0x18);
    cctxParams.cParams.targetLength = (int)*(undefined8 *)((long)dict_local + 0x30);
    cctxParams.cParams.strategy = (int)((ulong)*(undefined8 *)((long)dict_local + 0x30) >> 0x20);
    cctxParams.fParams._0_8_ = *(undefined8 *)((long)dict_local + 0x38);
    cctxParams._40_8_ = *(undefined8 *)((long)dict_local + 0x40);
    cctxParams._48_8_ = *(undefined8 *)((long)dict_local + 0x48);
    cctxParams._56_8_ = *(undefined8 *)((long)dict_local + 0x50);
    cctxParams.jobSize = *(undefined8 *)((long)dict_local + 0x58);
    cctxParams._72_8_ = *(undefined8 *)((long)dict_local + 0x60);
    cctxParams.ldmParams._0_8_ = *(undefined8 *)((long)dict_local + 0x68);
    cctxParams.ldmParams._8_8_ = *(undefined8 *)((long)dict_local + 0x70);
    cctxParams.ldmParams._16_8_ = *(undefined8 *)((long)dict_local + 0x78);
    cctxParams.customMem.customAlloc = (ZSTD_allocFunction)*(undefined8 *)((long)dict_local + 0x80);
    cctxParams.customMem.customFree = (ZSTD_freeFunction)*(undefined8 *)((long)dict_local + 0x88);
    cctxParams.customMem.opaque = (void *)params.cParams._0_8_;
    params_01.fParams.checksumFlag = (int)in_stack_ffffffffffffff10;
    params_01.fParams.noDictIDFlag = (int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
    auVar2 = SUB3228(params._8_32_,0);
    params_01.cParams.windowLog = auVar2._0_4_;
    params_01.cParams.chainLog = auVar2._4_4_;
    params_01.cParams.hashLog = auVar2._8_4_;
    params_01.cParams.searchLog = auVar2._12_4_;
    params_01.cParams.minMatch = auVar2._16_4_;
    params_01.cParams.targetLength = auVar2._20_4_;
    params_01.cParams.strategy = auVar2._24_4_;
    params_01.fParams.contentSizeFlag = SUB324(params._8_32_,0x1c);
    ZSTD_assignParamsToCCtxParams(cctxParams,params_01);
    memcpy(__dest,local_b8,0x80);
    params_00.cParams.strategy = (int)((ulong)*(undefined8 *)((long)dict_local + 0x28) >> 0x20);
    params_00._0_28_ = *(undefined1 (*) [28])((long)dict_local + 0x10);
    params_00.fParams.contentSizeFlag = (int)*(undefined8 *)((long)dict_local + 0x30);
    params_00.fParams.checksumFlag = (int)((ulong)*(undefined8 *)((long)dict_local + 0x30) >> 0x20);
    params_00._40_8_ = *(undefined8 *)((long)dict_local + 0x38);
    params_00._48_8_ = *(undefined8 *)((long)dict_local + 0x40);
    params_00._56_8_ = *(undefined8 *)((long)dict_local + 0x48);
    params_00.jobSize = *(undefined8 *)((long)dict_local + 0x50);
    params_00._72_8_ = *(undefined8 *)((long)dict_local + 0x58);
    params_00.ldmParams._0_8_ = *(undefined8 *)((long)dict_local + 0x60);
    params_00.ldmParams._8_8_ = *(undefined8 *)((long)dict_local + 0x68);
    params_00.ldmParams._16_8_ = *(undefined8 *)((long)dict_local + 0x70);
    params_00.customMem.customAlloc = (ZSTD_allocFunction)*(undefined8 *)((long)dict_local + 0x78);
    params_00.customMem.customFree = (ZSTD_freeFunction)*(undefined8 *)((long)dict_local + 0x80);
    params_00.customMem.opaque = *(void **)((long)dict_local + 0x88);
    zcs_local = (ZSTD_CStream *)
                ZSTD_initCStream_internal
                          ((ZSTD_CStream *)dict_local,(void *)dictSize_local,pledgedSrcSize_local,
                           (ZSTD_CDict *)0x0,params_00,errcod);
  }
  else {
    zcs_local = local_38;
  }
  return (size_t)zcs_local;
}

Assistant:

size_t ZSTD_initCStream_advanced(ZSTD_CStream* zcs,
                                 const void* dict, size_t dictSize,
                                 ZSTD_parameters params, unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_initCStream_advanced: pledgedSrcSize=%u, flag=%u",
                (unsigned)pledgedSrcSize, params.fParams.contentSizeFlag);
    CHECK_F( ZSTD_checkCParams(params.cParams) );
    if ((pledgedSrcSize==0) && (params.fParams.contentSizeFlag==0)) pledgedSrcSize = ZSTD_CONTENTSIZE_UNKNOWN;  /* for compatibility with older programs relying on this behavior. Users should now specify ZSTD_CONTENTSIZE_UNKNOWN. This line will be removed in the future. */
    zcs->requestedParams = ZSTD_assignParamsToCCtxParams(zcs->requestedParams, params);
    return ZSTD_initCStream_internal(zcs, dict, dictSize, NULL /*cdict*/, zcs->requestedParams, pledgedSrcSize);
}